

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall
crnlib::symbol_codec::encode(symbol_codec *this,uint sym,adaptive_huffman_data_model *model)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  unsigned_short *puVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  record_put_bits(this,(uint)(model->m_codes).m_p[sym],(uint)(model->m_code_sizes).m_p[sym]);
  puVar4 = (model->m_sym_freq).m_p;
  uVar2 = puVar4[sym];
  puVar4[sym] = (unsigned_short)(uVar2 + 1);
  if (uVar2 + 1 == 0xffff) {
    uVar3 = model->m_total_syms;
    if ((ulong)uVar3 == 0) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      uVar5 = 0;
      do {
        uVar7 = puVar4[uVar6] + 1 >> 1;
        uVar5 = uVar5 + uVar7;
        puVar4[uVar6] = (unsigned_short)uVar7;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    model->m_total_count = uVar5;
  }
  puVar1 = &model->m_symbols_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    this->m_total_model_updates = this->m_total_model_updates + 1;
    adaptive_huffman_data_model::update(model);
    return;
  }
  return;
}

Assistant:

void symbol_codec::encode(uint sym, adaptive_huffman_data_model& model)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);
        CRNLIB_ASSERT(model.m_encoding);

        record_put_bits(model.m_codes[sym], model.m_code_sizes[sym]);

        uint freq = model.m_sym_freq[sym];
        freq++;
        model.m_sym_freq[sym] = static_cast<uint16>(freq);

        if (freq == cUINT16_MAX)
        {
            model.rescale();
        }

        if (--model.m_symbols_until_update == 0)
        {
            m_total_model_updates++;
            model.update();
        }
    }